

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O3

Mat * __thiscall
PatternGeneration::getChessTexture
          (PatternGeneration *this,Scalar *color1,Scalar *color2,int blockSize,int squares)

{
  Mat *pMVar1;
  Scalar *pSVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  int iVar4;
  int in_R9D;
  int iVar6;
  undefined1 auStack_e8 [8];
  Mat ROI;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  Scalar *local_68;
  Scalar *local_60;
  _InputArray local_58;
  Mat *local_40;
  int local_34;
  Scalar_ *pSVar5;
  
  local_68 = (Scalar *)CONCAT44(in_register_0000000c,blockSize);
  iVar3 = in_R9D * squares;
  pSVar5 = (Scalar_ *)auStack_e8;
  auStack_e8 = (undefined1  [8])0x0;
  _ROI = (Mat *)0x0;
  local_60 = color2;
  local_40 = (Mat *)this;
  cv::Mat::Mat((Mat *)this,iVar3,iVar3,0x10,pSVar5);
  iVar4 = (int)pSVar5;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  local_34 = iVar3;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      iVar6 = 0;
      do {
        local_58.obj = (void *)CONCAT44(squares,squares);
        local_58.flags = iVar3;
        local_58._4_4_ = iVar6;
        cv::Mat::Mat((Mat *)auStack_e8,local_40,(Rect_ *)&local_58);
        pSVar2 = local_68;
        if ((iVar6 + iVar3 & 1U) == 0) {
          pSVar2 = local_60;
        }
        local_88 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_80 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        local_78 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        dStack_70 = (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        local_58.flags = -0x3efdfffa;
        local_58.obj = &local_88;
        local_58.sz.width = 1;
        local_58.sz.height = 4;
        cv::noArray();
        cv::Mat::setTo((_InputArray *)auStack_e8,&local_58);
        cv::Mat::~Mat((Mat *)auStack_e8);
        iVar4 = (int)pSVar5;
        iVar6 = iVar6 + squares;
      } while (iVar6 < local_34);
      iVar3 = iVar3 + squares;
    } while (iVar3 < local_34);
  }
  pMVar1 = local_40;
  auStack_e8._0_4_ = 0x1010000;
  _ROI = local_40;
  local_58.sz.width = 0;
  local_58.sz.height = 0;
  local_58.flags = 0x2010000;
  local_58.obj = local_40;
  cv::cvtColor((cv *)auStack_e8,&local_58,(_OutputArray *)0x39,0,iVar4);
  return pMVar1;
}

Assistant:

cv::Mat PatternGeneration::getChessTexture(
    const cv::Scalar & color1,
    const cv::Scalar & color2,
    int blockSize,
    int squares)
{
    int imageSize=blockSize*squares;
    cv::Mat chessBoard(imageSize,imageSize,CV_8UC3,cv::Scalar::all(0));

    cv::Scalar color_;
    

    for (int i=0;i<imageSize;i=i+blockSize){
        for (int j=0;j<imageSize;j=j+blockSize){
            cv::Mat ROI=chessBoard(cv::Rect(i,j,blockSize,blockSize));
            if ((i+j) % 2 == 0) {
                color_ = color1;
            }
            else {
                color_=color2;
            
            }
            ROI.setTo(color_);
        }
    }


    cvtColor(chessBoard,chessBoard,cv::COLOR_Lab2RGB); // converting back to 8U with scaling
    return chessBoard;
}